

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O1

vector<std::reference_wrapper<duckdb::Binding>,_true> * __thiscall
duckdb::BindContext::GetBindings
          (vector<std::reference_wrapper<duckdb::Binding>,_true> *__return_storage_ptr__,
          BindContext *this,BindingAlias *alias,ErrorData *out_error)

{
  pointer *pprVar1;
  pointer puVar2;
  iterator __position;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *puVar3;
  pointer pcVar4;
  ErrorData *pEVar5;
  undefined1 auVar6 [8];
  bool bVar7;
  pointer pBVar8;
  string *psVar9;
  InternalException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *binding;
  pointer this_01;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  candidates;
  string candidate_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_178;
  ErrorData *local_158;
  undefined1 local_150 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  char local_120 [16];
  string local_110;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  string local_d0;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  undefined1 local_a0 [24];
  _Alloc_hider local_88;
  char local_78 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  local_158 = out_error;
  if ((alias->alias)._M_string_length != 0) {
    (__return_storage_ptr__->
    super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
    ).
    super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
    ).
    super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
    ).
    super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_01 = (this->bindings_list).
              super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->bindings_list).
             super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_01 != puVar2) {
      do {
        pBVar8 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator->
                           (this_01);
        bVar7 = BindingAlias::Matches(&pBVar8->alias,alias);
        if (bVar7) {
          local_b0 = (undefined1  [8])
                     unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                     operator*(this_01);
          __position._M_current =
               (__return_storage_ptr__->
               super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
               ).
               super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
              ).
              super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::
            vector<std::reference_wrapper<duckdb::Binding>,std::allocator<std::reference_wrapper<duckdb::Binding>>>
            ::_M_realloc_insert<std::reference_wrapper<duckdb::Binding>>
                      ((vector<std::reference_wrapper<duckdb::Binding>,std::allocator<std::reference_wrapper<duckdb::Binding>>>
                        *)__return_storage_ptr__,__position,
                       (reference_wrapper<duckdb::Binding> *)local_b0);
          }
          else {
            (__position._M_current)->_M_data = (Binding *)local_b0;
            pprVar1 = &(__return_storage_ptr__->
                       super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                       ).
                       super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pprVar1 = *pprVar1 + 1;
          }
        }
        this_01 = this_01 + 1;
      } while (this_01 != puVar2);
    }
    if ((__return_storage_ptr__->
        super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
        ).
        super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->
        super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
        ).
        super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_178.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar3 = (this->bindings_list).
               super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_02 = (this->bindings_list).
                     super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar3;
          this_02 = this_02 + 1) {
        pBVar8 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator->
                           (this_02);
        psVar9 = BindingAlias::GetAlias_abi_cxx11_(&pBVar8->alias);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_178,psVar9);
      }
      psVar9 = BindingAlias::GetAlias_abi_cxx11_(alias);
      StringUtil::TopNJaroWinkler
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_150,&local_178,psVar9,5,0.5);
      local_b0 = (undefined1  [8])local_a0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Candidate tables","");
      StringUtil::CandidatesMessage
                (&local_d0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_150,(string *)local_b0);
      if (local_b0 != (undefined1  [8])local_a0) {
        operator_delete((void *)local_b0);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_150);
      local_f0[0] = local_e0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f0,"Referenced table \"%s\" not found!%s","");
      psVar9 = BindingAlias::GetAlias_abi_cxx11_(alias);
      pcVar4 = (psVar9->_M_dataplus)._M_p;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar4,pcVar4 + psVar9->_M_string_length);
      local_130._M_allocated_capacity = (size_type)local_120;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_d0._M_dataplus._M_p,
                 local_d0._M_dataplus._M_p + local_d0._M_string_length);
      StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                ((string *)local_150,(StringUtil *)local_f0,&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                 in_R8);
      ErrorData::ErrorData((ErrorData *)local_b0,BINDER,(string *)local_150);
      auVar6 = local_b0;
      pEVar5 = local_158;
      local_158->initialized = (bool)local_b0[0];
      local_158->type = local_b0[1];
      local_b0 = auVar6;
      ::std::__cxx11::string::operator=((string *)&local_158->raw_message,(string *)&local_a8);
      ::std::__cxx11::string::operator=((string *)&pEVar5->final_message,(string *)&local_88);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)&pEVar5->extra_info,local_68);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_68);
      if (local_88._M_p != local_78) {
        operator_delete(local_88._M_p);
      }
      if (local_a8._M_p != local_a0 + 8) {
        operator_delete(local_a8._M_p);
      }
      if ((pointer)local_150._0_8_ != (pointer)(local_150 + 0x10)) {
        operator_delete((void *)local_150._0_8_);
      }
      if ((char *)local_130._M_allocated_capacity != local_120) {
        operator_delete((void *)local_130._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_178);
    }
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_b0 = (undefined1  [8])local_a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"BindingAlias is not set","")
  ;
  InternalException::InternalException(this_00,(string *)local_b0);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

vector<reference<Binding>> BindContext::GetBindings(const BindingAlias &alias, ErrorData &out_error) {
	if (!alias.IsSet()) {
		throw InternalException("BindingAlias is not set");
	}
	vector<reference<Binding>> matching_bindings;
	for (auto &binding : bindings_list) {
		if (binding->alias.Matches(alias)) {
			matching_bindings.push_back(*binding);
		}
	}
	if (matching_bindings.empty()) {
		// alias not found in this BindContext
		vector<string> candidates;
		for (auto &binding : bindings_list) {
			candidates.push_back(binding->alias.GetAlias());
		}
		string candidate_str = StringUtil::CandidatesMessage(StringUtil::TopNJaroWinkler(candidates, alias.GetAlias()),
		                                                     "Candidate tables");
		out_error = ErrorData(ExceptionType::BINDER, StringUtil::Format("Referenced table \"%s\" not found!%s",
		                                                                alias.GetAlias(), candidate_str));
	}
	return matching_bindings;
}